

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugScreen.cpp
# Opt level: O3

int DebugScreen::init(EVP_PKEY_CTX *ctx)

{
  unique_ptr<DebugScreen,_std::default_delete<DebugScreen>_> uVar1;
  _Head_base<0UL,_DebugScreen_*,_false> _Var2;
  Vector2<unsigned_int> *in_RDX;
  Private local_19;
  _Head_base<0UL,_DebugScreen_*,_false> local_18;
  uint local_c;
  
  details::
  make_unique<DebugScreen,_DebugScreen::Private,_const_sf::Font_&,_unsigned_int_&,_const_sf::Vector2<unsigned_int>_&,_0>
            ((details *)&local_18,&local_19,(Font *)ctx,&local_c,in_RDX);
  _Var2._M_head_impl = local_18._M_head_impl;
  uVar1 = instance_;
  local_18._M_head_impl = (DebugScreen *)0x0;
  instance_._M_t.super___uniq_ptr_impl<DebugScreen,_std::default_delete<DebugScreen>_>._M_t.
  super__Tuple_impl<0UL,_DebugScreen_*,_std::default_delete<DebugScreen>_>.
  super__Head_base<0UL,_DebugScreen_*,_false>._M_head_impl =
       (__uniq_ptr_data<DebugScreen,_std::default_delete<DebugScreen>,_true,_true>)
       (__uniq_ptr_data<DebugScreen,_std::default_delete<DebugScreen>,_true,_true>)
       _Var2._M_head_impl;
  if ((__uniq_ptr_impl<DebugScreen,_std::default_delete<DebugScreen>_>)
      uVar1._M_t.super___uniq_ptr_impl<DebugScreen,_std::default_delete<DebugScreen>_>._M_t.
      super__Tuple_impl<0UL,_DebugScreen_*,_std::default_delete<DebugScreen>_>.
      super__Head_base<0UL,_DebugScreen_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<DebugScreen,_std::default_delete<DebugScreen>_>)0x0) {
    _Var2._M_head_impl =
         (DebugScreen *)
         (**(code **)(*(long *)uVar1._M_t.
                               super___uniq_ptr_impl<DebugScreen,_std::default_delete<DebugScreen>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_DebugScreen_*,_std::default_delete<DebugScreen>_>
                               .super__Head_base<0UL,_DebugScreen_*,_false>._M_head_impl + 8))();
    if (local_18._M_head_impl != (DebugScreen *)0x0) {
      _Var2._M_head_impl = (DebugScreen *)(**(code **)(*(long *)local_18._M_head_impl + 8))();
    }
  }
  return (int)_Var2._M_head_impl;
}

Assistant:

void DebugScreen::init(const sf::Font& font, unsigned int characterSize, const sf::Vector2u& windowSize) {
    assert(!instance_);
    instance_ = details::make_unique<DebugScreen>(Private(), font, characterSize, windowSize);
}